

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlEntityDesc * htmlEntityLookup(xmlChar *name)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = xmlStrEqual(name,*(xmlChar **)((long)&html40EntitiesTable[0].name + lVar2));
    if (iVar1 != 0) {
      return (htmlEntityDesc *)((long)&html40EntitiesTable[0].value + lVar2);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x17b8);
  return (htmlEntityDesc *)0x0;
}

Assistant:

const htmlEntityDesc *
htmlEntityLookup(const xmlChar *name) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (xmlStrEqual(name, BAD_CAST html40EntitiesTable[i].name)) {
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}